

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O1

bool __thiscall
QStringListModel::insertRows(QStringListModel *this,int row,int count,QModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayData *local_48;
  char16_t *pcStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row && 0 < count) {
    iVar2 = (**(code **)(*(long *)this + 0x78))(this,parent);
    if (row <= iVar2) {
      local_48 = (QArrayData *)0xffffffffffffffff;
      pcStack_40 = (char16_t *)0x0;
      tStack_38.ptr = (QAbstractItemModel *)0x0;
      QAbstractItemModel::beginInsertRows
                ((QAbstractItemModel *)this,(QModelIndex *)&local_48,row,row + count + -1);
      if (0 < count) {
        do {
          local_48 = (QArrayData *)0x0;
          pcStack_40 = (char16_t *)0x0;
          tStack_38.ptr = (QAbstractItemModel *)0x0;
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)(this + 0x10),(ulong)(uint)row,
                     (QString *)&local_48);
          QList<QString>::begin((QList<QString> *)(this + 0x10));
          if (local_48 != (QArrayData *)0x0) {
            LOCK();
            (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_48,2,0x10);
            }
          }
          count = count + -1;
        } while (count != 0);
      }
      QAbstractItemModel::endInsertRows((QAbstractItemModel *)this);
      bVar1 = true;
      goto LAB_0049ffda;
    }
  }
  bVar1 = false;
LAB_0049ffda:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QStringListModel::insertRows(int row, int count, const QModelIndex &parent)
{
    if (count < 1 || row < 0 || row > rowCount(parent))
        return false;

    beginInsertRows(QModelIndex(), row, row + count - 1);

    for (int r = 0; r < count; ++r)
        lst.insert(row, QString());

    endInsertRows();

    return true;
}